

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cppwriteinitialization.cpp
# Opt level: O1

void __thiscall CPP::WriteInitialization::Item::addChild(Item *this,Item *child)

{
  Item **ppIVar1;
  TemporaryVariableGeneratorPolicy TVar2;
  ulong uVar3;
  ulong uVar4;
  Data *pDVar5;
  long in_FS_OFFSET;
  Item *local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_40 = child;
  QtPrivate::QPodArrayOps<CPP::WriteInitialization::Item*>::
  emplace<CPP::WriteInitialization::Item*&>
            ((QPodArrayOps<CPP::WriteInitialization::Item*> *)&this->m_children,
             (this->m_children).d.size,&local_40);
  QList<CPP::WriteInitialization::Item_*>::end(&this->m_children);
  child->m_parent = this;
  do {
    pDVar5 = (child->m_setupUiData).directives.q_hash.d;
    if ((this->m_setupUiData).directives.q_hash.d != pDVar5) {
      if (pDVar5 == (Data *)0x0) {
LAB_001331d1:
        pDVar5 = (Data *)0x0;
LAB_001331d4:
        uVar4 = 0;
      }
      else {
        if (pDVar5->spans->offsets[0] != 0xff) goto LAB_001331d4;
        uVar3 = 1;
        do {
          uVar4 = uVar3;
          if (pDVar5->numBuckets == uVar4) goto LAB_001331d1;
          uVar3 = uVar4 + 1;
        } while (pDVar5->spans[uVar4 >> 7].offsets[(uint)uVar4 & 0x7f] == 0xff);
      }
      if (pDVar5 != (Data *)0x0 || uVar4 != 0) {
        do {
          QHash<QString,QHashDummyValue>::emplace<QHashDummyValue_const&>
                    ((QHash<QString,QHashDummyValue> *)&(this->m_setupUiData).directives,
                     (QString *)
                     (((pDVar5->spans[uVar4 >> 7].entries)->storage).data +
                     (uint)pDVar5->spans[uVar4 >> 7].offsets[(uint)uVar4 & 0x7f] * 0x18),
                     (QHashDummyValue *)&local_40);
          do {
            if (pDVar5->numBuckets - 1 == uVar4) {
              uVar4 = 0;
              pDVar5 = (Data *)0x0;
              break;
            }
            uVar4 = uVar4 + 1;
          } while (pDVar5->spans[uVar4 >> 7].offsets[(uint)uVar4 & 0x7f] == 0xff);
        } while ((uVar4 != 0) || (pDVar5 != (Data *)0x0));
      }
    }
    pDVar5 = (child->m_retranslateUiData).directives.q_hash.d;
    if ((this->m_retranslateUiData).directives.q_hash.d != pDVar5) {
      if (pDVar5 == (Data *)0x0) {
LAB_001332ab:
        pDVar5 = (Data *)0x0;
LAB_001332ae:
        uVar4 = 0;
      }
      else {
        if (pDVar5->spans->offsets[0] != 0xff) goto LAB_001332ae;
        uVar3 = 1;
        do {
          uVar4 = uVar3;
          if (pDVar5->numBuckets == uVar4) goto LAB_001332ab;
          uVar3 = uVar4 + 1;
        } while (pDVar5->spans[uVar4 >> 7].offsets[(uint)uVar4 & 0x7f] == 0xff);
      }
      if (pDVar5 != (Data *)0x0 || uVar4 != 0) {
        do {
          QHash<QString,QHashDummyValue>::emplace<QHashDummyValue_const&>
                    ((QHash<QString,QHashDummyValue> *)&(this->m_retranslateUiData).directives,
                     (QString *)
                     (((pDVar5->spans[uVar4 >> 7].entries)->storage).data +
                     (uint)pDVar5->spans[uVar4 >> 7].offsets[(uint)uVar4 & 0x7f] * 0x18),
                     (QHashDummyValue *)&local_40);
          do {
            if (pDVar5->numBuckets - 1 == uVar4) {
              uVar4 = 0;
              pDVar5 = (Data *)0x0;
              break;
            }
            uVar4 = uVar4 + 1;
          } while (pDVar5->spans[uVar4 >> 7].offsets[(uint)uVar4 & 0x7f] == 0xff);
        } while ((uVar4 != 0) || (pDVar5 != (Data *)0x0));
      }
    }
    TVar2 = (child->m_setupUiData).policy;
    if ((int)(this->m_setupUiData).policy < (int)TVar2) {
      (this->m_setupUiData).policy = TVar2;
    }
    TVar2 = (child->m_retranslateUiData).policy;
    if ((int)(this->m_retranslateUiData).policy < (int)TVar2) {
      (this->m_retranslateUiData).policy = TVar2;
    }
    ppIVar1 = &this->m_parent;
    child = this;
    this = *ppIVar1;
    if (*ppIVar1 == (Item *)0x0) {
      if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
        __stack_chk_fail();
      }
      return;
    }
  } while( true );
}

Assistant:

void WriteInitialization::Item::addChild(Item *child)
{
    m_children << child;
    child->m_parent = this;

    Item *c = child;
    Item *p = this;
    while (p) {
        p->m_setupUiData.directives |= c->m_setupUiData.directives;
        p->m_retranslateUiData.directives |= c->m_retranslateUiData.directives;
        if (p->m_setupUiData.policy < c->m_setupUiData.policy)
            p->m_setupUiData.policy = c->m_setupUiData.policy;
        if (p->m_retranslateUiData.policy < c->m_retranslateUiData.policy)
            p->m_retranslateUiData.policy = c->m_retranslateUiData.policy;
        c = p;
        p = p->m_parent;
    }
}